

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * unpack4_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in & 0xf;
  *out = base + *out;
  puVar1 = out + 1;
  *puVar1 = *in >> 4 & 0xf;
  *puVar1 = base + *puVar1;
  puVar1 = out + 2;
  *puVar1 = *in >> 8 & 0xf;
  *puVar1 = base + *puVar1;
  puVar1 = out + 3;
  *puVar1 = *in >> 0xc & 0xf;
  *puVar1 = base + *puVar1;
  puVar1 = out + 4;
  *puVar1 = *in >> 0x10 & 0xf;
  *puVar1 = base + *puVar1;
  puVar1 = out + 5;
  *puVar1 = *in >> 0x14 & 0xf;
  *puVar1 = base + *puVar1;
  puVar1 = out + 6;
  *puVar1 = *in >> 0x18 & 0xf;
  *puVar1 = base + *puVar1;
  puVar1 = out + 7;
  *puVar1 = *in >> 0x1c;
  puVar2 = in + 1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 8;
  *puVar1 = *puVar2 & 0xf;
  *puVar1 = base + *puVar1;
  puVar1 = out + 9;
  *puVar1 = *puVar2 >> 4 & 0xf;
  *puVar1 = base + *puVar1;
  puVar1 = out + 10;
  *puVar1 = *puVar2 >> 8 & 0xf;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = *puVar2 >> 0xc & 0xf;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = *puVar2 >> 0x10 & 0xf;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = *puVar2 >> 0x14 & 0xf;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = *puVar2 >> 0x18 & 0xf;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = *puVar2 >> 0x1c;
  *puVar1 = base + *puVar1;
  return in + 2;
}

Assistant:

uint32_t * unpack4_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  )   % (1U << 4 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}